

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_false>::rebuild_
          (DaTrie<true,_false,_false> *this,DaTrie<true,_false,_false> *rhs_trie)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RSI;
  DaTrie<true,_false,_false> *in_RDI;
  uint32_t rhs_child_pos;
  uint8_t label;
  uint8_t *__end3;
  uint8_t *__begin3;
  Edge *__range3;
  uint32_t rhs_base;
  Edge edge;
  Query query;
  char *tail;
  NodePair node_pair;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  np_stack;
  value_type *in_stack_fffffffffffffe18;
  Edge *__x;
  undefined4 in_stack_fffffffffffffe20;
  uint32_t in_stack_fffffffffffffe24;
  DaTrie<true,_false,_false> *in_stack_fffffffffffffe28;
  Edge *in_stack_fffffffffffffe30;
  DaTrie<true,_false,_false> *in_stack_fffffffffffffe38;
  DaTrie<true,_false,_false> *in_stack_fffffffffffffe40;
  Query *query_00;
  uint local_1a4;
  pair<unsigned_int,_unsigned_int> local_1a0;
  uint local_198;
  byte local_191;
  byte *local_190;
  byte *local_188;
  Edge *local_180;
  uint32_t local_174;
  Edge local_170;
  undefined1 local_68 [36];
  value_type local_44;
  pair<unsigned_int,_unsigned_int> local_3c [2];
  Query local_28;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *local_10;
  
  local_10 = in_RSI;
  bVar1 = is_empty((DaTrie<true,_false,_false> *)0x163e49);
  if (!bVar1) {
    query_00 = &local_28;
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)0x163e66);
    num_nodes((DaTrie<true,_false,_false> *)
              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::reserve((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)in_RDI,(size_type)query_00);
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
              (local_3c,&ROOT_POS,&ROOT_POS);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                in_stack_fffffffffffffe18);
    fix_(in_stack_fffffffffffffe40,(uint32_t)((ulong)in_stack_fffffffffffffe38 >> 0x20),
         (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_fffffffffffffe30);
    pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](local_10,0);
    Bc::set_check(pvVar3,0x7fffffff);
    while (bVar1 = std::
                   vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ::empty((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            *)in_stack_fffffffffffffe30), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar4 = std::
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ::back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      local_44 = *pvVar4;
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::pop_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)0x163f23);
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         (&in_RDI->bc_,(ulong)local_44 & 0xffffffff);
      bVar1 = Bc::is_leaf(pvVar5);
      if (bVar1) {
        bVar1 = is_terminal_(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
        if (bVar1) {
          in_stack_fffffffffffffe40 =
               (DaTrie<true,_false,_false> *)
               std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         (local_10,(ulong)local_44 >> 0x20);
          pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                             (&in_RDI->bc_,(ulong)local_44 & 0xffffffff);
          uVar2 = Bc::value(pvVar5);
          Bc::set_value((Bc *)in_stack_fffffffffffffe40,uVar2);
        }
        else {
          in_stack_fffffffffffffe38 =
               (DaTrie<true,_false,_false> *)
               std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x163fcc);
          pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                             (&in_RDI->bc_,(ulong)local_44 & 0xffffffff);
          uVar2 = Bc::value(pvVar5);
          local_68._24_8_ =
               (long)&(in_stack_fffffffffffffe38->bc_).
                      super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                      super__Vector_impl_data._M_start + (ulong)uVar2;
          Query::Query((Query *)local_68,(char *)local_68._24_8_);
          in_stack_fffffffffffffe28 = (DaTrie<true,_false,_false> *)local_68._24_8_;
          uVar2 = utils::length((char *)0x164029);
          uVar2 = utils::extract_value
                            ((char *)((long)&(in_stack_fffffffffffffe28->bc_).
                                             super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                             _M_impl.super__Vector_impl_data._M_start + (ulong)uVar2
                                     ));
          in_stack_fffffffffffffe30 = (Edge *)local_68;
          Query::set_value((Query *)in_stack_fffffffffffffe30,uVar2);
          Query::set_node_pos((Query *)in_stack_fffffffffffffe30,local_44.second);
          insert_tail_(in_RDI,query_00);
          Query::~Query((Query *)local_68);
        }
      }
      else {
        Edge::Edge(&local_170);
        __x = &local_170;
        edge_(in_stack_fffffffffffffe40,(uint32_t)((ulong)in_stack_fffffffffffffe38 >> 0x20),
              in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe24 =
             xcheck_(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)
                     in_stack_fffffffffffffe28);
        local_174 = in_stack_fffffffffffffe24;
        pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                           (local_10,(ulong)local_44 >> 0x20);
        Bc::set_base(pvVar3,local_174);
        local_180 = &local_170;
        local_188 = Edge::begin(local_180);
        local_190 = Edge::end(local_180);
        for (; local_188 != local_190; local_188 = local_188 + 1) {
          local_191 = *local_188;
          local_198 = local_174 ^ local_191;
          fix_(in_stack_fffffffffffffe40,(uint32_t)((ulong)in_stack_fffffffffffffe38 >> 0x20),
               (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_fffffffffffffe30)
          ;
          pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                             (local_10,(ulong)local_198);
          Bc::set_check(pvVar3,local_44.second);
          pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                             (&in_RDI->bc_,(ulong)local_44 & 0xffffffff);
          uVar2 = Bc::base(pvVar5);
          local_1a4 = uVar2 ^ local_191;
          std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int_&,_true>
                    (&local_1a0,&local_1a4,&local_198);
          std::
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      (value_type *)__x);
        }
        Edge::~Edge(&local_170);
      }
    }
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)in_stack_fffffffffffffe30);
  }
  return;
}

Assistant:

void rebuild_(DaTrie& rhs_trie) const {
    assert(rhs_trie.is_empty());

    if (is_empty()) {
      return;
    }

    using NodePair = std::pair<uint32_t, uint32_t>;

    std::vector<NodePair> np_stack;
    np_stack.reserve(num_nodes());
    np_stack.push_back({ROOT_POS, ROOT_POS});

    rhs_trie.fix_(ROOT_POS, rhs_trie.blocks_);
    rhs_trie.bc_[ROOT_POS].set_check(INVALID_VALUE);

    while (!np_stack.empty()) {
      const NodePair node_pair = np_stack.back();
      np_stack.pop_back();

      if (WithNLM) {
        rhs_trie.node_links_[node_pair.second] = node_links_[node_pair.first];
      }

      if (bc_[node_pair.first].is_leaf()) {
        if (is_terminal_(node_pair.first)) {
          rhs_trie.bc_[node_pair.second].set_value(bc_[node_pair.first].value());
        } else {
          auto tail = tail_.data() + bc_[node_pair.first].value();
          Query query(tail);
          query.set_value(utils::extract_value(tail + utils::length(tail)));
          query.set_node_pos(node_pair.second);
          rhs_trie.insert_tail_(query);
        }
        continue;
      }

      Edge edge;
      edge_(node_pair.first, edge);

      auto rhs_base = rhs_trie.xcheck_(edge, rhs_trie.blocks_);
      rhs_trie.bc_[node_pair.second].set_base(rhs_base);

      for (auto label : edge) {
        auto rhs_child_pos = rhs_base ^label;
        rhs_trie.fix_(rhs_child_pos, rhs_trie.blocks_);
        rhs_trie.bc_[rhs_child_pos].set_check(node_pair.second);
        np_stack.push_back({bc_[node_pair.first].base() ^ label, rhs_child_pos});
      }
    }
  }